

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O1

void __thiscall
ConfidentialTransactionController_AddPegoutTxOut2_Test::TestBody
          (ConfidentialTransactionController_AddPegoutTxOut2_Test *this)

{
  bool bVar1;
  Amount AVar2;
  AssertionResult gtest_ar;
  undefined1 local_760 [24];
  undefined1 local_748 [16];
  char local_738 [16];
  char *local_728;
  undefined1 local_720 [32];
  string local_700;
  undefined1 local_6e0 [16];
  char local_6d0 [16];
  Amount local_6c0;
  ByteData local_6b0;
  string local_698;
  Pubkey local_678;
  undefined1 local_660 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_650;
  uchar local_640 [16];
  pointer local_630;
  pointer local_618;
  pointer local_600;
  TapBranch local_5e8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_570;
  Script local_558;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_518;
  ConfidentialTransactionController txc;
  Privkey local_498;
  ConfidentialTxOutReference local_478;
  ConfidentialTxOutReference local_380;
  ConfidentialTxOutReference local_288;
  ConfidentialTxInReference local_190;
  
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&txc,2,0);
  gtest_ar._0_8_ = local_760;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             "");
  cfd::core::Txid::Txid((Txid *)local_660,(string *)&gtest_ar);
  cfd::ConfidentialTransactionController::AddTxIn(&local_190,&txc,(Txid *)local_660,0,0xfffffffd);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_190);
  local_660._0_8_ = &PTR__Txid_00735400;
  if ((pointer)local_660._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_660._8_8_);
  }
  if ((undefined1 *)gtest_ar._0_8_ != local_760) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  local_748._0_8_ = local_738;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_748,"XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA","");
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address
            ((Address *)local_660,(string *)local_748,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_720);
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_6e0._0_8_ = AVar2.amount_;
  local_6e0[8] = AVar2.ignore_check_;
  local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_700,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar,&local_700);
  cfd::ConfidentialTransactionController::AddTxOut
            (&local_288,&txc,(Address *)local_660,(Amount *)local_6e0,
             (ConfidentialAssetId *)&gtest_ar);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_288);
  gtest_ar._0_8_ = &PTR__ConfidentialAssetId_00735710;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700._M_dataplus._M_p != &local_700.field_2) {
    operator_delete(local_700._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_518);
  cfd::core::Script::~Script(&local_558);
  local_5e8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_570);
  cfd::core::TapBranch::~TapBranch(&local_5e8);
  if (local_600 != (pointer)0x0) {
    operator_delete(local_600);
  }
  if (local_618 != (pointer)0x0) {
    operator_delete(local_618);
  }
  if (local_630 != (pointer)0x0) {
    operator_delete(local_630);
  }
  if ((uchar *)local_650._M_allocated_capacity != local_640) {
    operator_delete((void *)local_650._M_allocated_capacity);
  }
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_720);
  if ((char *)local_748._0_8_ != local_738) {
    operator_delete((void *)local_748._0_8_);
  }
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(1000000000);
  local_6c0.amount_ = AVar2.amount_;
  local_6c0.ignore_check_ = AVar2.ignore_check_;
  local_748._0_8_ = local_738;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_748,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             "");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar,(string *)local_748);
  local_720._0_8_ = local_720 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_720,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206",
             "");
  cfd::core::BlockHash::BlockHash((BlockHash *)&local_700,(string *)local_720);
  local_6e0._0_8_ = local_6d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6e0,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo","");
  cfd::core::Address::Address((Address *)local_660,(string *)local_6e0);
  cfd::core::Pubkey::Pubkey(&local_678);
  cfd::core::Privkey::Privkey(&local_498);
  local_728 = "";
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"");
  cfd::core::ByteData::ByteData(&local_6b0);
  cfd::ConfidentialTransactionController::AddPegoutTxOut
            (&local_380,&txc,&local_6c0,(ConfidentialAssetId *)&gtest_ar,(BlockHash *)&local_700,
             (Address *)local_660,kMainnet,&local_678,&local_498,&local_698,0,&local_6b0,kLiquidV1,
             (Address *)0x0);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_380);
  if (local_6b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6b0.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p);
  }
  if (local_498.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_678.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_678.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_518);
  cfd::core::Script::~Script(&local_558);
  local_5e8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_570);
  cfd::core::TapBranch::~TapBranch(&local_5e8);
  if (local_600 != (pointer)0x0) {
    operator_delete(local_600);
  }
  if (local_618 != (pointer)0x0) {
    operator_delete(local_618);
  }
  if (local_630 != (pointer)0x0) {
    operator_delete(local_630);
  }
  if ((uchar *)local_650._M_allocated_capacity != local_640) {
    operator_delete((void *)local_650._M_allocated_capacity);
  }
  if ((char *)local_6e0._0_8_ != local_6d0) {
    operator_delete((void *)local_6e0._0_8_);
  }
  local_700._M_dataplus._M_p = (pointer)&PTR__BlockHash_00735740;
  if ((void *)local_700._M_string_length != (void *)0x0) {
    operator_delete((void *)local_700._M_string_length);
  }
  if ((pointer)local_720._0_8_ != (pointer)(local_720 + 0x10)) {
    operator_delete((void *)local_720._0_8_);
  }
  gtest_ar._0_8_ = &PTR__ConfidentialAssetId_00735710;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((char *)local_748._0_8_ != local_738) {
    operator_delete((void *)local_748._0_8_);
  }
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  local_748._0_8_ = AVar2.amount_;
  local_748[8] = AVar2.ignore_check_;
  gtest_ar._0_8_ = local_760;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             "");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_660,(string *)&gtest_ar);
  cfd::ConfidentialTransactionController::AddTxOutFee
            (&local_478,&txc,(Amount *)local_748,(ConfidentialAssetId *)local_660);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_478);
  local_660._0_8_ = &PTR__ConfidentialAssetId_00735710;
  if ((pointer)local_660._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_660._8_8_);
  }
  if ((undefined1 *)gtest_ar._0_8_ != local_760) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)local_660,&txc.super_AbstractTransactionController);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txc.GetHex().c_str()",
             "\"020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000\""
             ,(char *)local_660._0_8_,
             "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000"
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._0_8_ != &local_650) {
    operator_delete((void *)local_660._0_8_);
  }
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_660);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      local_728 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_748,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0xf8,local_728);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_748,(Message *)local_660);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_748);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_660._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_660._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_660._0_8_ + 8))();
      }
      local_660._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  txc.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&PTR__ConfidentialTransactionController_00735388;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&txc.transaction_);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, AddPegoutTxOut2)
{
    ConfidentialTransactionController txc(2, 0);
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"));
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");

}